

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_vote.cxx
# Opt level: O2

void __thiscall nuraft::raft_server::handle_vote_resp(raft_server *this,resp_msg *resp)

{
  bool bVar1;
  uint uVar2;
  element_type *peVar3;
  ulong uVar4;
  char *pcVar5;
  int iVar6;
  int32 iVar7;
  uint uVar8;
  srv_role _role;
  srv_role _role_00;
  string *this_00;
  string sStack_88;
  element_type *local_68;
  ulong local_60;
  ulong local_58;
  string local_50;
  
  this_00 = &sStack_88;
  if (this->election_completed_ == true) {
    peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar3 == (element_type *)0x0) {
      return;
    }
    iVar6 = (**(code **)(*(long *)peVar3 + 0x38))();
    if (iVar6 < 4) {
      return;
    }
    peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    msg_if_given_abi_cxx11_
              (&sStack_88,"Election completed, will ignore the voting result from this server");
    (**(code **)(*(long *)peVar3 + 0x40))
              (peVar3,4,
               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
               ,"handle_vote_resp",0x164,&sStack_88);
    this_00 = &sStack_88;
  }
  else if ((resp->super_msg_base).term_ ==
           (((this->state_).super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            )->term_).super___atomic_base<unsigned_long>._M_i) {
    iVar6 = this->votes_responded_ + 1;
    this->votes_responded_ = iVar6;
    if (resp->accepted_ == true) {
      this->votes_granted_ = this->votes_granted_ + 1;
    }
    iVar7 = get_num_voting_members(this);
    if (iVar7 <= iVar6) {
      this->election_completed_ = true;
    }
    iVar7 = get_quorum_for_election(this);
    peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar3 != (element_type *)0x0) &&
       (iVar6 = (**(code **)(*(long *)peVar3 + 0x38))(), 3 < iVar6)) {
      local_68 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      uVar2 = (resp->super_msg_base).src_;
      bVar1 = resp->accepted_;
      uVar4 = (resp->super_msg_base).term_;
      srv_role_to_string_abi_cxx11_(&local_50,(nuraft *)(ulong)(this->role_)._M_i,_role);
      local_60 = (ulong)(uint)this->votes_responded_;
      local_58 = (ulong)(uint)this->votes_granted_;
      uVar8 = get_num_voting_members(this);
      pcVar5 = "XX";
      if (bVar1 != false) {
        pcVar5 = "NO";
      }
      msg_if_given_abi_cxx11_
                (&sStack_88,
                 "[VOTE RESP] peer %d (%s), resp term %lu, my role %s, granted %d, responded %d, num voting members %d, quorum %d\n"
                 ,(ulong)uVar2,pcVar5 + 1,uVar4,local_50._M_dataplus._M_p,local_58,local_60,
                 (ulong)uVar8,(ulong)(iVar7 + 1));
      (**(code **)(*(long *)local_68 + 0x40))
                (local_68,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                 ,"handle_vote_resp",0x181,&sStack_88);
      std::__cxx11::string::~string((string *)&sStack_88);
      std::__cxx11::string::~string((string *)&local_50);
    }
    if (this->votes_granted_ <= iVar7) {
      return;
    }
    peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar3 != (element_type *)0x0) &&
       (iVar6 = (**(code **)(*(long *)peVar3 + 0x38))(), 3 < iVar6)) {
      peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                (&sStack_88,"Server is elected as leader for term %lu",
                 (((this->state_).super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->term_).super___atomic_base<unsigned_long>._M_i);
      (**(code **)(*(long *)peVar3 + 0x40))
                (peVar3,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                 ,"handle_vote_resp",0x184,&sStack_88);
      std::__cxx11::string::~string((string *)&sStack_88);
    }
    this->election_completed_ = true;
    become_leader(this);
    peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar3 == (element_type *)0x0) {
      return;
    }
    iVar6 = (**(code **)(*(long *)peVar3 + 0x38))();
    if (iVar6 < 4) {
      return;
    }
    peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    msg_if_given_abi_cxx11_
              (&sStack_88,"  === LEADER (term %lu) ===\n",
               (((this->state_).super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->term_).super___atomic_base<unsigned_long>._M_i);
    (**(code **)(*(long *)peVar3 + 0x40))
              (peVar3,4,
               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
               ,"handle_vote_resp",0x187,&sStack_88);
  }
  else {
    peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar3 == (element_type *)0x0) {
      return;
    }
    iVar6 = (**(code **)(*(long *)peVar3 + 0x38))();
    if (iVar6 < 4) {
      return;
    }
    peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    uVar2 = (resp->super_msg_base).src_;
    srv_role_to_string_abi_cxx11_(&local_50,(nuraft *)(ulong)(this->role_)._M_i,_role_00);
    msg_if_given_abi_cxx11_
              (&sStack_88,
               "[VOTE RESP] from peer %d, my role %s, but different resp term %lu. ignore it.",
               (ulong)uVar2,local_50._M_dataplus._M_p,(resp->super_msg_base).term_);
    (**(code **)(*(long *)peVar3 + 0x40))
              (peVar3,4,
               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
               ,"handle_vote_resp",0x16c,&sStack_88);
    std::__cxx11::string::~string((string *)&sStack_88);
    this_00 = &local_50;
  }
  std::__cxx11::string::~string((string *)this_00);
  return;
}

Assistant:

void raft_server::handle_vote_resp(resp_msg& resp) {
    if (election_completed_) {
        p_in("Election completed, will ignore the voting result from this server");
        return;
    }

    if (resp.get_term() != state_->get_term()) {
        // Vote response for other term. Should ignore it.
        p_in("[VOTE RESP] from peer %d, my role %s, "
             "but different resp term %" PRIu64 ". ignore it.",
             resp.get_src(), srv_role_to_string(role_).c_str(), resp.get_term());
        return;
    }
    votes_responded_ += 1;

    if (resp.get_accepted()) {
        votes_granted_ += 1;
    }

    if (votes_responded_ >= get_num_voting_members()) {
        election_completed_ = true;
    }

    int32 election_quorum_size = get_quorum_for_election() + 1;

    p_in("[VOTE RESP] peer %d (%s), resp term %" PRIu64 ", my role %s, "
         "granted %d, responded %d, "
         "num voting members %d, quorum %d\n",
         resp.get_src(), (resp.get_accepted()) ? "O" : "X", resp.get_term(),
         srv_role_to_string(role_).c_str(),
         (int)votes_granted_, (int)votes_responded_,
         get_num_voting_members(), election_quorum_size);

    if (votes_granted_ >= election_quorum_size) {
        p_in("Server is elected as leader for term %" PRIu64, state_->get_term());
        election_completed_ = true;
        become_leader();
        p_in("  === LEADER (term %" PRIu64 ") ===\n", state_->get_term());
    }
}